

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompiler::LocalDecl(string *__return_storage_ptr__,Decompiler *this,string *name,Type t)

{
  string_view name_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string struc;
  allocator local_79;
  string_view local_78;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  LoadStoreTracking::GenTypeDecl(&local_48,&this->lst,name);
  name_00.data_ = (name->_M_dataplus)._M_p;
  name_00.size_ = name->_M_string_length;
  local_78 = VarName(this,name_00);
  if (local_48._M_string_length != 0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    goto LAB_0014c690;
  }
  switch(t.enum_) {
  case I8U:
    pcVar1 = "ubyte";
    break;
  case I16U:
    pcVar1 = "ushort";
    break;
  case I32U:
    pcVar1 = "uint";
    break;
  case ExnRef:
    pcVar1 = "exnref";
    break;
  case 0xffffffe9:
  case 0xffffffea:
  case 0xffffffeb:
  case ExnRef|I8U:
  case 0xffffffed:
  case ExnRef|I16U:
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
  case Any:
  case ~I64:
  case ~F32:
  case ~F64:
  case ~I8:
switchD_0014c5de_caseD_ffffffe9:
    pcVar1 = "ILLEGAL";
    break;
  case ExternRef:
    pcVar1 = "externref";
    break;
  case FuncRef:
    pcVar1 = "funcref";
    break;
  case I16:
    pcVar1 = "short";
    break;
  case I8:
    pcVar1 = "byte";
    break;
  case V128:
    pcVar1 = "simd";
    break;
  case F64:
    pcVar1 = "double";
    break;
  case F32:
    pcVar1 = "float";
    break;
  case I64:
    pcVar1 = "long";
    break;
  case I32:
    pcVar1 = "int";
    break;
  default:
    if (t.enum_ == Void) {
      pcVar1 = "void";
    }
    else {
      if (t.enum_ != Func) goto switchD_0014c5de_caseD_ffffffe9;
      pcVar1 = "func";
    }
  }
  std::__cxx11::string::string((string *)local_68,pcVar1,&local_79);
LAB_0014c690:
  cat<wabt::string_view,char[2],std::__cxx11::string>
            (__return_storage_ptr__,(wabt *)&local_78,(string_view *)":",(char (*) [2])local_68,
             in_R8);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LocalDecl(const std::string& name, Type t) {
    auto struc = lst.GenTypeDecl(name);
    return cat(VarName(name), ":",
               struc.empty() ? GetDecompTypeName(t) : struc);
  }